

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O3

void helicsMessageClear(HelicsMessage message,HelicsError *err)

{
  if (err == (HelicsError *)0x0) {
    if (message == (HelicsMessage)0x0) {
      return;
    }
    if (*(short *)((long)message + 10) != 0xb3) {
      return;
    }
  }
  else {
    if (err->error_code != 0) {
      return;
    }
    if ((message == (HelicsMessage)0x0) || (*(short *)((long)message + 10) != 0xb3)) {
      err->error_code = -4;
      err->message = "The message object was not valid";
      return;
    }
  }
  *(undefined8 *)message = 0;
  *(undefined2 *)((long)message + 8) = 0;
  *(undefined4 *)((long)message + 0xc) = 0;
  helics::SmallBuffer::reserve((SmallBuffer *)((long)message + 0x10),0);
  *(undefined8 *)((long)message + 0x50) = 0;
  *(undefined8 *)((long)message + 0x78) = 0;
  **(undefined1 **)((long)message + 0x70) = 0;
  *(undefined8 *)((long)message + 0x98) = 0;
  **(undefined1 **)((long)message + 0x90) = 0;
  *(undefined8 *)((long)message + 0xb8) = 0;
  **(undefined1 **)((long)message + 0xb0) = 0;
  *(undefined8 *)((long)message + 0xd8) = 0;
  **(undefined1 **)((long)message + 0xd0) = 0;
  *(undefined4 *)((long)message + 0xf0) = 0;
  return;
}

Assistant:

helics::Message* getMessageObj(HelicsMessage message, HelicsError* err)
{
    HELICS_ERROR_CHECK(err, nullptr);
    auto* mess = reinterpret_cast<helics::Message*>(message);
    if (mess == nullptr || mess->messageValidation != messageKeyCode) {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidMessageObject);
        return nullptr;
    }
    return mess;
}